

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  NodeList *__x;
  NodeList adjList;
  TraverseMinimizer sb;
  ofstream outfile;
  ifstream input;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Syntax: ./project3 <input_file> <output_file> [verbose]");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "(add any character to the end to output results to the console)");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 1;
  }
  else {
    std::ifstream::ifstream(&input,argv[1],_S_in);
    InputParser::InputParser((InputParser *)&outfile,&input);
    __x = InputParser::parse((InputParser *)&outfile);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector(&adjList,__x);
    TraverseMinimizer::TraverseMinimizer(&sb,&adjList);
    if (3 < argc) {
      report((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&sb.startingPoints);
    }
    std::ofstream::ofstream(&outfile,argv[2],_S_out);
    report((basic_ostream<char,_std::char_traits<char>_> *)&outfile,&sb.startingPoints);
    std::ofstream::~ofstream(&outfile);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&sb);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              (&adjList.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
    std::ifstream::~ifstream(&input);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    bool verbose = argc > 3;
    if (argc < 3) {
        std::cout << "Syntax: ./project3 <input_file> <output_file> [verbose]" << std::endl;
        std::cout << "(add any character to the end to output results to the console)" << std::endl;
        return 1;
    }

    std::ifstream input(argv[1]);
    NodeList adjList = InputParser(input).parse();
    TraverseMinimizer sb(adjList);

    if (verbose) {
        report(std::cout, sb.startingPoints);
    }

    std::ofstream outfile(argv[2]);
    report(outfile, sb.startingPoints);
}